

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveColumnsTable(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_2d70;
  QModelIndex local_2d58;
  undefined1 local_2d40 [8];
  value_type args_3;
  qsizetype local_2d20;
  QSignalSpy *local_2d18;
  QSignalSpy *spy_9;
  QSignalSpy **__end1_9;
  QSignalSpy **__begin1_9;
  QSignalSpy *(*__range1_9) [2];
  QString local_2ce0;
  QVariant local_2cc8;
  QString local_2ca8;
  QVariant local_2c90;
  QVariant local_2c70;
  QVariant local_2c50;
  QVariant local_2c30;
  QVariant local_2c10;
  QVariant local_2bf0;
  QArrayDataPointer<char16_t> local_2bd0;
  QString local_2bb8;
  QModelIndex local_2ba0;
  QModelIndex local_2b88;
  QVariant local_2b70;
  QString local_2b50;
  QArrayDataPointer<char16_t> local_2b38;
  QString local_2b20;
  QModelIndex local_2b08;
  QModelIndex local_2af0;
  QVariant local_2ad8;
  QString local_2ab8;
  QArrayDataPointer<char16_t> local_2aa0;
  QString local_2a88;
  QModelIndex local_2a70;
  QModelIndex local_2a58;
  QVariant local_2a40;
  QString local_2a20;
  QArrayDataPointer<char16_t> local_2a08;
  QString local_29f0;
  QModelIndex local_29d8;
  QModelIndex local_29c0;
  QVariant local_29a8;
  QString local_2988;
  QArrayDataPointer<char16_t> local_2970;
  QString local_2958;
  QModelIndex local_2940;
  QModelIndex local_2928;
  QVariant local_2910;
  QString local_28f0;
  QArrayDataPointer<char16_t> local_28d8;
  QString local_28c0;
  QModelIndex local_28a8;
  QModelIndex local_2890;
  QVariant local_2878;
  QString local_2858;
  QArrayDataPointer<char16_t> local_2840;
  QString local_2828;
  QModelIndex local_2810;
  QModelIndex local_27f8;
  QVariant local_27e0;
  QString local_27c0;
  QArrayDataPointer<char16_t> local_27a8;
  QString local_2790;
  QModelIndex local_2778;
  QModelIndex local_2760;
  QVariant local_2748;
  QString local_2728;
  QArrayDataPointer<char16_t> local_2710;
  QString local_26f8;
  QModelIndex local_26e0;
  QModelIndex local_26c8;
  QVariant local_26b0;
  QString local_2690;
  QArrayDataPointer<char16_t> local_2678;
  QString local_2660;
  QModelIndex local_2648;
  QModelIndex local_2630;
  QVariant local_2618;
  QString local_25f8;
  QArrayDataPointer<char16_t> local_25e0;
  QString local_25c8;
  QModelIndex local_25b0;
  QModelIndex local_2598;
  QVariant local_2580;
  QString local_2560;
  QArrayDataPointer<char16_t> local_2548;
  QString local_2530;
  QModelIndex local_2518;
  QModelIndex local_2500;
  QVariant local_24e8;
  QString local_24c8;
  QModelIndex local_24b0;
  QModelIndex local_2498;
  QModelIndex local_2480;
  undefined1 local_2468 [24];
  QPersistentModelIndex local_2450 [8];
  QPersistentModelIndex oneOneIndex;
  QModelIndex local_2430;
  QModelIndex local_2418;
  undefined1 local_2400 [8];
  value_type args_2;
  qsizetype local_23e0;
  QSignalSpy *local_23d8;
  QSignalSpy *spy_8;
  QSignalSpy **__end1_8;
  QSignalSpy **__begin1_8;
  QSignalSpy *(*__range1_8) [2];
  QString local_23a0;
  QVariant local_2388;
  QString local_2368;
  QVariant local_2350;
  QVariant local_2330;
  QVariant local_2310;
  QVariant local_22f0;
  QVariant local_22d0;
  QVariant local_22b0;
  QArrayDataPointer<char16_t> local_2290;
  QString local_2278;
  QModelIndex local_2260;
  QModelIndex local_2248;
  QVariant local_2230;
  QString local_2210;
  QArrayDataPointer<char16_t> local_21f8;
  QString local_21e0;
  QModelIndex local_21c8;
  QModelIndex local_21b0;
  QVariant local_2198;
  QString local_2178;
  QArrayDataPointer<char16_t> local_2160;
  QString local_2148;
  QModelIndex local_2130;
  QModelIndex local_2118;
  QVariant local_2100;
  QString local_20e0;
  QArrayDataPointer<char16_t> local_20c8;
  QString local_20b0;
  QModelIndex local_2098;
  QModelIndex local_2080;
  QVariant local_2068;
  QString local_2048;
  QArrayDataPointer<char16_t> local_2030;
  QString local_2018;
  QModelIndex local_2000;
  QModelIndex local_1fe8;
  QVariant local_1fd0;
  QString local_1fb0;
  QArrayDataPointer<char16_t> local_1f98;
  QString local_1f80;
  QModelIndex local_1f68;
  QModelIndex local_1f50;
  QVariant local_1f38;
  QString local_1f18;
  QArrayDataPointer<char16_t> local_1f00;
  QString local_1ee8;
  QModelIndex local_1ed0;
  QModelIndex local_1eb8;
  QVariant local_1ea0;
  QString local_1e80;
  QArrayDataPointer<char16_t> local_1e68;
  QString local_1e50;
  QModelIndex local_1e38;
  QModelIndex local_1e20;
  QVariant local_1e08;
  QString local_1de8;
  QArrayDataPointer<char16_t> local_1dd0;
  QString local_1db8;
  QModelIndex local_1da0;
  QModelIndex local_1d88;
  QVariant local_1d70;
  QString local_1d50;
  QArrayDataPointer<char16_t> local_1d38;
  QString local_1d20;
  QModelIndex local_1d08;
  QModelIndex local_1cf0;
  QVariant local_1cd8;
  QString local_1cb8;
  QArrayDataPointer<char16_t> local_1ca0;
  QString local_1c88;
  QModelIndex local_1c70;
  QModelIndex local_1c58;
  QVariant local_1c40;
  QString local_1c20;
  QArrayDataPointer<char16_t> local_1c08;
  QString local_1bf0;
  QModelIndex local_1bd8;
  QModelIndex local_1bc0;
  QVariant local_1ba8;
  QString local_1b88;
  QModelIndex local_1b70;
  QModelIndex local_1b58;
  QModelIndex local_1b40;
  undefined1 local_1b28 [24];
  QModelIndex local_1b10;
  QModelIndex local_1af8;
  QModelIndex local_1ae0;
  undefined1 local_1ac8 [8];
  value_type args_1;
  qsizetype local_1aa8;
  QSignalSpy *local_1aa0;
  QSignalSpy *spy_7;
  QSignalSpy **__end1_7;
  QSignalSpy **__begin1_7;
  QSignalSpy *(*__range1_7) [2];
  QString local_1a68;
  QVariant local_1a50;
  QString local_1a30;
  QVariant local_1a18;
  QVariant local_19f8;
  QVariant local_19d8;
  QVariant local_19b8;
  QVariant local_1998;
  QVariant local_1978;
  QArrayDataPointer<char16_t> local_1958;
  QString local_1940;
  QModelIndex local_1928;
  QModelIndex local_1910;
  QVariant local_18f8;
  QString local_18d8;
  QArrayDataPointer<char16_t> local_18c0;
  QString local_18a8;
  QModelIndex local_1890;
  QModelIndex local_1878;
  QVariant local_1860;
  QString local_1840;
  QArrayDataPointer<char16_t> local_1828;
  QString local_1810;
  QModelIndex local_17f8;
  QModelIndex local_17e0;
  QVariant local_17c8;
  QString local_17a8;
  QArrayDataPointer<char16_t> local_1790;
  QString local_1778;
  QModelIndex local_1760;
  QModelIndex local_1748;
  QVariant local_1730;
  QString local_1710;
  QArrayDataPointer<char16_t> local_16f8;
  QString local_16e0;
  QModelIndex local_16c8;
  QModelIndex local_16b0;
  QVariant local_1698;
  QString local_1678;
  QArrayDataPointer<char16_t> local_1660;
  QString local_1648;
  QModelIndex local_1630;
  QModelIndex local_1618;
  QVariant local_1600;
  QString local_15e0;
  QArrayDataPointer<char16_t> local_15c8;
  QString local_15b0;
  QModelIndex local_1598;
  QModelIndex local_1580;
  QVariant local_1568;
  QString local_1548;
  QArrayDataPointer<char16_t> local_1530;
  QString local_1518;
  QModelIndex local_1500;
  QModelIndex local_14e8;
  QVariant local_14d0;
  QString local_14b0;
  QArrayDataPointer<char16_t> local_1498;
  QString local_1480;
  QModelIndex local_1468;
  QModelIndex local_1450;
  QVariant local_1438;
  QString local_1418;
  QArrayDataPointer<char16_t> local_1400;
  QString local_13e8;
  QModelIndex local_13d0;
  QModelIndex local_13b8;
  QVariant local_13a0;
  QString local_1380;
  QArrayDataPointer<char16_t> local_1368;
  QString local_1350;
  QModelIndex local_1338;
  QModelIndex local_1320;
  QVariant local_1308;
  QString local_12e8;
  QArrayDataPointer<char16_t> local_12d0;
  QString local_12b8;
  QModelIndex local_12a0;
  QModelIndex local_1288;
  QVariant local_1270;
  QString local_1250;
  QModelIndex local_1238;
  QModelIndex local_1220;
  QModelIndex local_1208;
  undefined1 local_11f0 [24];
  QModelIndex local_11d8;
  QModelIndex local_11c0;
  QModelIndex local_11a8;
  undefined1 local_1190 [8];
  value_type args;
  qsizetype local_1170;
  QSignalSpy *local_1168;
  QSignalSpy *spy_6;
  QSignalSpy **__end1_6;
  QSignalSpy **__begin1_6;
  QSignalSpy *(*__range1_6) [2];
  QString local_1130;
  QVariant local_1118;
  QString local_10f8;
  QVariant local_10e0;
  QVariant local_10c0;
  QVariant local_10a0;
  QVariant local_1080;
  QVariant local_1060;
  QVariant local_1040;
  QArrayDataPointer<char16_t> local_1020;
  QString local_1008;
  QModelIndex local_ff0;
  QModelIndex local_fd8;
  QVariant local_fc0;
  QString local_fa0;
  QArrayDataPointer<char16_t> local_f88;
  QString local_f70;
  QModelIndex local_f58;
  QModelIndex local_f40;
  QVariant local_f28;
  QString local_f08;
  QArrayDataPointer<char16_t> local_ef0;
  QString local_ed8;
  QModelIndex local_ec0;
  QModelIndex local_ea8;
  QVariant local_e90;
  QString local_e70;
  QArrayDataPointer<char16_t> local_e58;
  QString local_e40;
  QModelIndex local_e28;
  QModelIndex local_e10;
  QVariant local_df8;
  QString local_dd8;
  QArrayDataPointer<char16_t> local_dc0;
  QString local_da8;
  QModelIndex local_d90;
  QModelIndex local_d78;
  QVariant local_d60;
  QString local_d40;
  QArrayDataPointer<char16_t> local_d28;
  QString local_d10;
  QModelIndex local_cf8;
  QModelIndex local_ce0;
  QVariant local_cc8;
  QString local_ca8;
  QArrayDataPointer<char16_t> local_c90;
  QString local_c78;
  QModelIndex local_c60;
  QModelIndex local_c48;
  QVariant local_c30;
  QString local_c10;
  QArrayDataPointer<char16_t> local_bf8;
  QString local_be0;
  QModelIndex local_bc8;
  QModelIndex local_bb0;
  QVariant local_b98;
  QString local_b78;
  QArrayDataPointer<char16_t> local_b60;
  QString local_b48;
  QModelIndex local_b30;
  QModelIndex local_b18;
  QVariant local_b00;
  QString local_ae0;
  QArrayDataPointer<char16_t> local_ac8;
  QString local_ab0;
  QModelIndex local_a98;
  QModelIndex local_a80;
  QVariant local_a68;
  QString local_a48;
  QArrayDataPointer<char16_t> local_a30;
  QString local_a18;
  QModelIndex local_a00;
  QModelIndex local_9e8;
  QVariant local_9d0;
  QString local_9b0;
  QArrayDataPointer<char16_t> local_998;
  QString local_980;
  QModelIndex local_968;
  QModelIndex local_950;
  QVariant local_938;
  QString local_918;
  QModelIndex local_900;
  QModelIndex local_8e8;
  QModelIndex local_8d0;
  undefined1 local_8b8 [24];
  QPersistentModelIndex local_8a0 [8];
  QPersistentModelIndex oneTwoIndex;
  qint32 local_894;
  qsizetype local_890;
  QSignalSpy *local_888;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  QModelIndex local_850;
  qint32 local_834;
  qsizetype local_830;
  QSignalSpy *local_828;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QModelIndex local_7f0;
  qint32 local_7d4;
  qsizetype local_7d0;
  QSignalSpy *local_7c8;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  QModelIndex local_790;
  qint32 local_774;
  qsizetype local_770;
  QSignalSpy *local_768;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  QModelIndex local_730;
  qint32 local_714;
  qsizetype local_710;
  QSignalSpy *local_708;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  QModelIndex local_6d0;
  qint32 local_6b4;
  qsizetype local_6b0;
  QSignalSpy *local_6a8;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QModelIndex local_670;
  QSignalSpy *local_658;
  QSignalSpy *spyArr [2];
  QSignalSpy columnsMovedSpy;
  undefined1 local_5c0 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  undefined1 local_518 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  char16_t *str_51;
  char16_t *str_50;
  char16_t *str_49;
  char16_t *str_48;
  char16_t *str_47;
  char16_t *str_46;
  char16_t *str_45;
  char16_t *str_44;
  char16_t *str_43;
  char16_t *str_42;
  char16_t *str_41;
  char16_t *str_40;
  char16_t *str_39;
  char16_t *str_38;
  char16_t *str_37;
  char16_t *str_36;
  char16_t *str_35;
  char16_t *str_34;
  char16_t *str_33;
  char16_t *str_32;
  char16_t *str_31;
  char16_t *str_30;
  char16_t *str_29;
  char16_t *str_28;
  char16_t *str_27;
  char16_t *str_26;
  char16_t *str_25;
  char16_t *str_24;
  char16_t *str_23;
  char16_t *str_22;
  char16_t *str_21;
  char16_t *str_20;
  char16_t *str_19;
  char16_t *str_18;
  char16_t *str_17;
  char16_t *str_16;
  char16_t *str_15;
  char16_t *str_14;
  char16_t *str_13;
  char16_t *str_12;
  char16_t *str_11;
  char16_t *str_10;
  char16_t *str_9;
  char16_t *str_8;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_518,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0)
  ;
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  fillTable(this,(QAbstractItemModel *)&probe.field_0x8,2,6,
            (QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting,0);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_5c0,(QObject *)&probe.field_0x8,
             "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_5c0);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7df);
  if ((bVar2 & 1) != 0) {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)(spyArr + 1),(QObject *)&probe.field_0x8,
               "2columnsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)(spyArr + 1));
    bVar2 = QTest::qVerify(bVar1,"columnsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x7e1);
    if ((bVar2 & 1) != 0) {
      local_658 = (QSignalSpy *)local_5c0;
      spyArr[0] = (QSignalSpy *)(spyArr + 1);
      QModelIndex::QModelIndex(&local_670);
      QModelIndex::QModelIndex((QModelIndex *)&__range1);
      bVar2 = GenericModel::moveColumns
                        ((QModelIndex *)&probe.field_0x8,(int)&local_670,2,(QModelIndex *)0x1,
                         (int)(QModelIndex *)&__range1);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                             "!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), -1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7e4);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = &local_658;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_6a8 = *__end1;
          local_6b0 = QList<QList<QVariant>_>::count(&local_6a8->super_QList<QList<QVariant>_>);
          local_6b4 = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_6b0,&local_6b4,"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7e6);
          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
        }
        QModelIndex::QModelIndex(&local_6d0);
        QModelIndex::QModelIndex((QModelIndex *)&__range1_1);
        bVar2 = GenericModel::moveColumns
                          ((QModelIndex *)&probe.field_0x8,(int)&local_6d0,2,(QModelIndex *)0x1,
                           (int)(QModelIndex *)&__range1_1);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                               "!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 7)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x7e7);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = &local_658;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_708 = *__end1_1;
            local_710 = QList<QList<QVariant>_>::count(&local_708->super_QList<QList<QVariant>_>);
            local_714 = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_710,&local_714,"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x7e9);
            if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
          }
          QModelIndex::QModelIndex(&local_730);
          QModelIndex::QModelIndex((QModelIndex *)&__range1_2);
          bVar2 = GenericModel::moveColumns
                            ((QModelIndex *)&probe.field_0x8,(int)&local_730,-1,(QModelIndex *)0x1,
                             (int)(QModelIndex *)&__range1_2);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveColumns(QModelIndex(), -1, 1, QModelIndex(), 3)",""
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x7ea);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = &local_658;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_768 = *__end1_2;
              local_770 = QList<QList<QVariant>_>::count(&local_768->super_QList<QList<QVariant>_>);
              local_774 = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_770,&local_774,"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x7ec);
              if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
            }
            QModelIndex::QModelIndex(&local_790);
            QModelIndex::QModelIndex((QModelIndex *)&__range1_3);
            bVar2 = GenericModel::moveColumns
                              ((QModelIndex *)&probe.field_0x8,(int)&local_790,6,(QModelIndex *)0x1,
                               (int)(QModelIndex *)&__range1_3);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveColumns(QModelIndex(), 6, 1, QModelIndex(), 3)",
                                   "",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x7ed);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = &local_658;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_7c8 = *__end1_3;
                local_7d0 = QList<QList<QVariant>_>::count
                                      (&local_7c8->super_QList<QList<QVariant>_>);
                local_7d4 = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_7d0,&local_7d4,"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x7ef);
                if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
              }
              QModelIndex::QModelIndex(&local_7f0);
              QModelIndex::QModelIndex((QModelIndex *)&__range1_4);
              bVar2 = GenericModel::moveColumns
                                ((QModelIndex *)&probe.field_0x8,(int)&local_7f0,1,
                                 (QModelIndex *)0x2,(int)(QModelIndex *)&__range1_4);
              bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                     "!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 2)"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x7f0);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                spy_4 = (QSignalSpy *)(spyArr + 1);
                __end1_4 = &local_658;
                __begin1_4 = __end1_4;
                for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                  local_828 = *__end1_4;
                  local_830 = QList<QList<QVariant>_>::count
                                        (&local_828->super_QList<QList<QVariant>_>);
                  local_834 = 0;
                  bVar1 = QTest::qCompare<long_long,int>
                                    (&local_830,&local_834,"spy->count()","0",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x7f2);
                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
                }
                QModelIndex::QModelIndex(&local_850);
                QModelIndex::QModelIndex((QModelIndex *)&__range1_5);
                bVar2 = GenericModel::moveColumns
                                  ((QModelIndex *)&probe.field_0x8,(int)&local_850,1,
                                   (QModelIndex *)0x2,(int)(QModelIndex *)&__range1_5);
                bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                       "!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 3)"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x7f3);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  spy_5 = (QSignalSpy *)(spyArr + 1);
                  __end1_5 = &local_658;
                  __begin1_5 = __end1_5;
                  for (; (QSignalSpy *)__end1_5 != spy_5; __end1_5 = __end1_5 + 1) {
                    local_888 = *__end1_5;
                    local_890 = QList<QList<QVariant>_>::count
                                          (&local_888->super_QList<QList<QVariant>_>);
                    local_894 = 0;
                    bVar1 = QTest::qCompare<long_long,int>
                                      (&local_890,&local_894,"spy->count()","0",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x7f5);
                    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149012;
                  }
                  QModelIndex::QModelIndex(&local_8d0);
                  GenericModel::index((int)local_8b8,(int)&probe + 8,(QModelIndex *)0x1);
                  QPersistentModelIndex::QPersistentModelIndex(local_8a0,(QModelIndex *)local_8b8);
                  QModelIndex::QModelIndex(&local_8e8);
                  QModelIndex::QModelIndex(&local_900);
                  bVar2 = GenericModel::moveColumns
                                    ((QModelIndex *)&probe.field_0x8,(int)&local_8e8,2,
                                     (QModelIndex *)0x1,(int)&local_900);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 4)"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x7f8);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_968);
                    GenericModel::index((int)&local_950,(int)&probe + 8,(QModelIndex *)0x0);
                    QModelIndex::data(&local_938,&local_950,0);
                    QVariant::toString();
                    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_998,(Data *)0x0,L"0,0",3);
                    QString::QString(&local_980,&local_998);
                    bVar1 = QTest::qCompare(&local_918,&local_980,
                                            "testModel.index(0, 0).data().toString()",
                                            "QStringLiteral(\"0,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x7f9);
                    QString::~QString(&local_980);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_998);
                    QString::~QString(&local_918);
                    QVariant::~QVariant(&local_938);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_a00);
                      GenericModel::index((int)&local_9e8,(int)&probe + 8,(QModelIndex *)0x0);
                      QModelIndex::data(&local_9d0,&local_9e8,0);
                      QVariant::toString();
                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                (&local_a30,(Data *)0x0,L"0,1",3);
                      QString::QString(&local_a18,&local_a30);
                      bVar1 = QTest::qCompare(&local_9b0,&local_a18,
                                              "testModel.index(0, 1).data().toString()",
                                              "QStringLiteral(\"0,1\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x7fa);
                      QString::~QString(&local_a18);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a30);
                      QString::~QString(&local_9b0);
                      QVariant::~QVariant(&local_9d0);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        QModelIndex::QModelIndex(&local_a98);
                        GenericModel::index((int)&local_a80,(int)&probe + 8,(QModelIndex *)0x0);
                        QModelIndex::data(&local_a68,&local_a80,0);
                        QVariant::toString();
                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                  (&local_ac8,(Data *)0x0,L"0,3",3);
                        QString::QString(&local_ab0,&local_ac8);
                        bVar1 = QTest::qCompare(&local_a48,&local_ab0,
                                                "testModel.index(0, 2).data().toString()",
                                                "QStringLiteral(\"0,3\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x7fb);
                        QString::~QString(&local_ab0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_ac8);
                        QString::~QString(&local_a48);
                        QVariant::~QVariant(&local_a68);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          QModelIndex::QModelIndex(&local_b30);
                          GenericModel::index((int)&local_b18,(int)&probe + 8,(QModelIndex *)0x0);
                          QModelIndex::data(&local_b00,&local_b18,0);
                          QVariant::toString();
                          QArrayDataPointer<char16_t>::QArrayDataPointer
                                    (&local_b60,(Data *)0x0,L"0,2",3);
                          QString::QString(&local_b48,&local_b60);
                          bVar1 = QTest::qCompare(&local_ae0,&local_b48,
                                                  "testModel.index(0, 3).data().toString()",
                                                  "QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7fc);
                          QString::~QString(&local_b48);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b60);
                          QString::~QString(&local_ae0);
                          QVariant::~QVariant(&local_b00);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_bc8);
                            GenericModel::index((int)&local_bb0,(int)&probe + 8,(QModelIndex *)0x0);
                            QModelIndex::data(&local_b98,&local_bb0,0);
                            QVariant::toString();
                            QArrayDataPointer<char16_t>::QArrayDataPointer
                                      (&local_bf8,(Data *)0x0,L"0,4",3);
                            QString::QString(&local_be0,&local_bf8);
                            bVar1 = QTest::qCompare(&local_b78,&local_be0,
                                                    "testModel.index(0, 4).data().toString()",
                                                    "QStringLiteral(\"0,4\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7fd);
                            QString::~QString(&local_be0);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_bf8);
                            QString::~QString(&local_b78);
                            QVariant::~QVariant(&local_b98);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              QModelIndex::QModelIndex(&local_c60);
                              GenericModel::index((int)&local_c48,(int)&probe + 8,(QModelIndex *)0x0
                                                 );
                              QModelIndex::data(&local_c30,&local_c48,0);
                              QVariant::toString();
                              QArrayDataPointer<char16_t>::QArrayDataPointer
                                        (&local_c90,(Data *)0x0,L"0,5",3);
                              QString::QString(&local_c78,&local_c90);
                              bVar1 = QTest::qCompare(&local_c10,&local_c78,
                                                      "testModel.index(0, 5).data().toString()",
                                                      "QStringLiteral(\"0,5\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7fe);
                              QString::~QString(&local_c78);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c90);
                              QString::~QString(&local_c10);
                              QVariant::~QVariant(&local_c30);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                QModelIndex::QModelIndex(&local_cf8);
                                GenericModel::index((int)&local_ce0,(int)&probe + 8,
                                                    (QModelIndex *)0x1);
                                QModelIndex::data(&local_cc8,&local_ce0,0);
                                QVariant::toString();
                                QArrayDataPointer<char16_t>::QArrayDataPointer
                                          (&local_d28,(Data *)0x0,L"1,0",3);
                                QString::QString(&local_d10,&local_d28);
                                bVar1 = QTest::qCompare(&local_ca8,&local_d10,
                                                        "testModel.index(1, 0).data().toString()",
                                                        "QStringLiteral(\"1,0\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7ff);
                                QString::~QString(&local_d10);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d28);
                                QString::~QString(&local_ca8);
                                QVariant::~QVariant(&local_cc8);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  QModelIndex::QModelIndex(&local_d90);
                                  GenericModel::index((int)&local_d78,(int)&probe + 8,
                                                      (QModelIndex *)0x1);
                                  QModelIndex::data(&local_d60,&local_d78,0);
                                  QVariant::toString();
                                  QArrayDataPointer<char16_t>::QArrayDataPointer
                                            (&local_dc0,(Data *)0x0,L"1,1",3);
                                  QString::QString(&local_da8,&local_dc0);
                                  bVar1 = QTest::qCompare(&local_d40,&local_da8,
                                                          "testModel.index(1, 1).data().toString()",
                                                          "QStringLiteral(\"1,1\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x800);
                                  QString::~QString(&local_da8);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_dc0);
                                  QString::~QString(&local_d40);
                                  QVariant::~QVariant(&local_d60);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    QModelIndex::QModelIndex(&local_e28);
                                    GenericModel::index((int)&local_e10,(int)&probe + 8,
                                                        (QModelIndex *)0x1);
                                    QModelIndex::data(&local_df8,&local_e10,0);
                                    QVariant::toString();
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (&local_e58,(Data *)0x0,L"1,3",3);
                                    QString::QString(&local_e40,&local_e58);
                                    bVar1 = QTest::qCompare(&local_dd8,&local_e40,
                                                                                                                        
                                                  "testModel.index(1, 2).data().toString()",
                                                  "QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x801);
                                    QString::~QString(&local_e40);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e58);
                                    QString::~QString(&local_dd8);
                                    QVariant::~QVariant(&local_df8);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      QModelIndex::QModelIndex(&local_ec0);
                                      GenericModel::index((int)&local_ea8,(int)&probe + 8,
                                                          (QModelIndex *)0x1);
                                      QModelIndex::data(&local_e90,&local_ea8,0);
                                      QVariant::toString();
                                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                                (&local_ef0,(Data *)0x0,L"1,2",3);
                                      QString::QString(&local_ed8,&local_ef0);
                                      bVar1 = QTest::qCompare(&local_e70,&local_ed8,
                                                                                                                            
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x802);
                                      QString::~QString(&local_ed8);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_ef0);
                                      QString::~QString(&local_e70);
                                      QVariant::~QVariant(&local_e90);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        QModelIndex::QModelIndex(&local_f58);
                                        GenericModel::index((int)&local_f40,(int)&probe + 8,
                                                            (QModelIndex *)0x1);
                                        QModelIndex::data(&local_f28,&local_f40,0);
                                        QVariant::toString();
                                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                                  (&local_f88,(Data *)0x0,L"1,4",3);
                                        QString::QString(&local_f70,&local_f88);
                                        bVar1 = QTest::qCompare(&local_f08,&local_f70,
                                                                                                                                
                                                  "testModel.index(1, 4).data().toString()",
                                                  "QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x803);
                                        QString::~QString(&local_f70);
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f88);
                                        QString::~QString(&local_f08);
                                        QVariant::~QVariant(&local_f28);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          QModelIndex::QModelIndex(&local_ff0);
                                          GenericModel::index((int)&local_fd8,(int)&probe + 8,
                                                              (QModelIndex *)0x1);
                                          QModelIndex::data(&local_fc0,&local_fd8,0);
                                          QVariant::toString();
                                          QArrayDataPointer<char16_t>::QArrayDataPointer
                                                    (&local_1020,(Data *)0x0,L"1,5",3);
                                          QString::QString(&local_1008,&local_1020);
                                          bVar1 = QTest::qCompare(&local_fa0,&local_1008,
                                                                                                                                    
                                                  "testModel.index(1, 5).data().toString()",
                                                  "QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x804);
                                          QString::~QString(&local_1008);
                                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                    (&local_1020);
                                          QString::~QString(&local_fa0);
                                          QVariant::~QVariant(&local_fc0);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            GenericModel::headerData
                                                      ((int)&local_1040,(int)&probe + 8,0);
                                            iVar3 = QVariant::toInt((bool *)&local_1040);
                                            bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x805);
                                            QVariant::~QVariant(&local_1040);
                                            if (((bVar2 ^ 0xff) & 1) == 0) {
                                              GenericModel::headerData
                                                        ((int)&local_1060,(int)&probe + 8,1);
                                              iVar3 = QVariant::toInt((bool *)&local_1060);
                                              bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x806);
                                              QVariant::~QVariant(&local_1060);
                                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                                GenericModel::headerData
                                                          ((int)&local_1080,(int)&probe + 8,2);
                                                iVar3 = QVariant::toInt((bool *)&local_1080);
                                                bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x807);
                                                QVariant::~QVariant(&local_1080);
                                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                                  GenericModel::headerData
                                                            ((int)&local_10a0,(int)&probe + 8,3);
                                                  iVar3 = QVariant::toInt((bool *)&local_10a0);
                                                  bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x808);
                                                  QVariant::~QVariant(&local_10a0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_10c0,(int)&probe + 8,4);
                                                    iVar3 = QVariant::toInt((bool *)&local_10c0);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x809);
                                                  QVariant::~QVariant(&local_10c0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_10e0,(int)&probe + 8,5);
                                                    iVar3 = QVariant::toInt((bool *)&local_10e0);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x80a);
                                                  QVariant::~QVariant(&local_10e0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_1118);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_6,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1130,
                                                                     (DataPointer *)&__range1_6);
                                                    bVar1 = QTest::qCompare(&local_10f8,&local_1130,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x80b);
                                                  QString::~QString(&local_1130);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_6);
                                                  QString::~QString(&local_10f8);
                                                  QVariant::~QVariant(&local_1118);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "oneTwoIndex.column()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x80c);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_6 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_6 = &local_658;
                                                    __begin1_6 = __end1_6;
                                                    for (; (QSignalSpy *)__end1_6 != spy_6;
                                                        __end1_6 = __end1_6 + 1) {
                                                      local_1168 = *__end1_6;
                                                      local_1170 = QList<QList<QVariant>_>::count
                                                                             (&local_1168->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1170,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x80e);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149006;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1190,
                                                             &local_1168->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1190,0);
                                                  QVariant::value<QModelIndex>(&local_11a8,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_11a8);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x810);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1190,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x811);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1190,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x812);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1190,3);
                                                    QVariant::value<QModelIndex>(&local_11c0,pQVar4)
                                                    ;
                                                    bVar1 = QModelIndex::isValid(&local_11c0);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x813);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1190,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "args.at(4).toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x814);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1190);
                                                  if (bVar1) goto LAB_00149006;
                                                  }
                                                  QModelIndex::QModelIndex(&local_11d8);
                                                  fillTable(this,(QAbstractItemModel *)
                                                                 &probe.field_0x8,2,6,&local_11d8,0)
                                                  ;
                                                  QModelIndex::QModelIndex(&local_1208);
                                                  GenericModel::index((int)local_11f0,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::operator=
                                                            (local_8a0,(QModelIndex *)local_11f0);
                                                  QModelIndex::QModelIndex(&local_1220);
                                                  QModelIndex::QModelIndex(&local_1238);
                                                  bVar2 = GenericModel::moveColumns
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)&local_1220,2,
                                                                     (QModelIndex *)0x1,
                                                                     (int)&local_1238);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x819);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_12a0);
                                                    GenericModel::index((int)&local_1288,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1270,&local_1288,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_12d0,(Data *)0x0,L"0,2",3);
                                                    QString::QString(&local_12b8,&local_12d0);
                                                    bVar1 = QTest::qCompare(&local_1250,&local_12b8,
                                                                                                                                                        
                                                  "testModel.index(0, 0).data().toString()",
                                                  "QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81a);
                                                  QString::~QString(&local_12b8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_12d0);
                                                  QString::~QString(&local_1250);
                                                  QVariant::~QVariant(&local_1270);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1338);
                                                    GenericModel::index((int)&local_1320,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1308,&local_1320,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1368,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_1350,&local_1368);
                                                    bVar1 = QTest::qCompare(&local_12e8,&local_1350,
                                                                                                                                                        
                                                  "testModel.index(0, 1).data().toString()",
                                                  "QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81b);
                                                  QString::~QString(&local_1350);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1368);
                                                  QString::~QString(&local_12e8);
                                                  QVariant::~QVariant(&local_1308);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_13d0);
                                                    GenericModel::index((int)&local_13b8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_13a0,&local_13b8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1400,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_13e8,&local_1400);
                                                    bVar1 = QTest::qCompare(&local_1380,&local_13e8,
                                                                                                                                                        
                                                  "testModel.index(0, 2).data().toString()",
                                                  "QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81c);
                                                  QString::~QString(&local_13e8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1400);
                                                  QString::~QString(&local_1380);
                                                  QVariant::~QVariant(&local_13a0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1468);
                                                    GenericModel::index((int)&local_1450,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1438,&local_1450,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1498,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_1480,&local_1498);
                                                    bVar1 = QTest::qCompare(&local_1418,&local_1480,
                                                                                                                                                        
                                                  "testModel.index(0, 3).data().toString()",
                                                  "QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81d);
                                                  QString::~QString(&local_1480);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1498);
                                                  QString::~QString(&local_1418);
                                                  QVariant::~QVariant(&local_1438);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1500);
                                                    GenericModel::index((int)&local_14e8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_14d0,&local_14e8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1530,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_1518,&local_1530);
                                                    bVar1 = QTest::qCompare(&local_14b0,&local_1518,
                                                                                                                                                        
                                                  "testModel.index(0, 4).data().toString()",
                                                  "QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81e);
                                                  QString::~QString(&local_1518);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1530);
                                                  QString::~QString(&local_14b0);
                                                  QVariant::~QVariant(&local_14d0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1598);
                                                    GenericModel::index((int)&local_1580,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1568,&local_1580,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_15c8,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_15b0,&local_15c8);
                                                    bVar1 = QTest::qCompare(&local_1548,&local_15b0,
                                                                                                                                                        
                                                  "testModel.index(0, 5).data().toString()",
                                                  "QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x81f);
                                                  QString::~QString(&local_15b0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_15c8);
                                                  QString::~QString(&local_1548);
                                                  QVariant::~QVariant(&local_1568);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1630);
                                                    GenericModel::index((int)&local_1618,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1600,&local_1618,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1660,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1648,&local_1660);
                                                    bVar1 = QTest::qCompare(&local_15e0,&local_1648,
                                                                                                                                                        
                                                  "testModel.index(1, 0).data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x820);
                                                  QString::~QString(&local_1648);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1660);
                                                  QString::~QString(&local_15e0);
                                                  QVariant::~QVariant(&local_1600);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_16c8);
                                                    GenericModel::index((int)&local_16b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1698,&local_16b0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_16f8,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_16e0,&local_16f8);
                                                    bVar1 = QTest::qCompare(&local_1678,&local_16e0,
                                                                                                                                                        
                                                  "testModel.index(1, 1).data().toString()",
                                                  "QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x821);
                                                  QString::~QString(&local_16e0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_16f8);
                                                  QString::~QString(&local_1678);
                                                  QVariant::~QVariant(&local_1698);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1760);
                                                    GenericModel::index((int)&local_1748,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1730,&local_1748,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1790,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_1778,&local_1790);
                                                    bVar1 = QTest::qCompare(&local_1710,&local_1778,
                                                                                                                                                        
                                                  "testModel.index(1, 2).data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x822);
                                                  QString::~QString(&local_1778);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1790);
                                                  QString::~QString(&local_1710);
                                                  QVariant::~QVariant(&local_1730);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_17f8);
                                                    GenericModel::index((int)&local_17e0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_17c8,&local_17e0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1828,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_1810,&local_1828);
                                                    bVar1 = QTest::qCompare(&local_17a8,&local_1810,
                                                                                                                                                        
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x823);
                                                  QString::~QString(&local_1810);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1828);
                                                  QString::~QString(&local_17a8);
                                                  QVariant::~QVariant(&local_17c8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1890);
                                                    GenericModel::index((int)&local_1878,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1860,&local_1878,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_18c0,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_18a8,&local_18c0);
                                                    bVar1 = QTest::qCompare(&local_1840,&local_18a8,
                                                                                                                                                        
                                                  "testModel.index(1, 4).data().toString()",
                                                  "QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x824);
                                                  QString::~QString(&local_18a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_18c0);
                                                  QString::~QString(&local_1840);
                                                  QVariant::~QVariant(&local_1860);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1928);
                                                    GenericModel::index((int)&local_1910,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_18f8,&local_1910,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1958,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_1940,&local_1958);
                                                    bVar1 = QTest::qCompare(&local_18d8,&local_1940,
                                                                                                                                                        
                                                  "testModel.index(1, 5).data().toString()",
                                                  "QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x825);
                                                  QString::~QString(&local_1940);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1958);
                                                  QString::~QString(&local_18d8);
                                                  QVariant::~QVariant(&local_18f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_1978,(int)&probe + 8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_1978);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x826);
                                                  QVariant::~QVariant(&local_1978);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_1998,(int)&probe + 8,1);
                                                    iVar3 = QVariant::toInt((bool *)&local_1998);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x827);
                                                  QVariant::~QVariant(&local_1998);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_19b8,(int)&probe + 8,2);
                                                    iVar3 = QVariant::toInt((bool *)&local_19b8);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x828);
                                                  QVariant::~QVariant(&local_19b8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_19d8,(int)&probe + 8,3);
                                                    iVar3 = QVariant::toInt((bool *)&local_19d8);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x829);
                                                  QVariant::~QVariant(&local_19d8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_19f8,(int)&probe + 8,4);
                                                    iVar3 = QVariant::toInt((bool *)&local_19f8);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82a);
                                                  QVariant::~QVariant(&local_19f8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_1a18,(int)&probe + 8,5);
                                                    iVar3 = QVariant::toInt((bool *)&local_1a18);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82b);
                                                  QVariant::~QVariant(&local_1a18);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_1a50);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_7,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1a68,
                                                                     (DataPointer *)&__range1_7);
                                                    bVar1 = QTest::qCompare(&local_1a30,&local_1a68,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82c);
                                                  QString::~QString(&local_1a68);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_7);
                                                  QString::~QString(&local_1a30);
                                                  QVariant::~QVariant(&local_1a50);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "oneTwoIndex.column()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82d);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_7 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_7 = &local_658;
                                                    __begin1_7 = __end1_7;
                                                    for (; (QSignalSpy *)__end1_7 != spy_7;
                                                        __end1_7 = __end1_7 + 1) {
                                                      local_1aa0 = *__end1_7;
                                                      local_1aa8 = QList<QList<QVariant>_>::count
                                                                             (&local_1aa0->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_1.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1aa8,
                                                                     (qint32 *)
                                                                     ((long)&args_1.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82f);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149006;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1ac8,
                                                             &local_1aa0->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1ac8,0);
                                                  QVariant::value<QModelIndex>(&local_1ae0,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_1ae0);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x831);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1ac8,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x832);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1ac8,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x833);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1ac8,3);
                                                    QVariant::value<QModelIndex>(&local_1af8,pQVar4)
                                                    ;
                                                    bVar1 = QModelIndex::isValid(&local_1af8);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x834);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1ac8,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x835);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1ac8);
                                                  if (bVar1) goto LAB_00149006;
                                                  }
                                                  QModelIndex::QModelIndex(&local_1b10);
                                                  fillTable(this,(QAbstractItemModel *)
                                                                 &probe.field_0x8,2,6,&local_1b10,0)
                                                  ;
                                                  QModelIndex::QModelIndex(&local_1b40);
                                                  GenericModel::index((int)local_1b28,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::operator=
                                                            (local_8a0,(QModelIndex *)local_1b28);
                                                  QModelIndex::QModelIndex(&local_1b58);
                                                  QModelIndex::QModelIndex(&local_1b70);
                                                  bVar2 = GenericModel::moveColumns
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)&local_1b58,2,
                                                                     (QModelIndex *)0x1,
                                                                     (int)&local_1b70);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 6)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83a);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1bd8);
                                                    GenericModel::index((int)&local_1bc0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1ba8,&local_1bc0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1c08,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_1bf0,&local_1c08);
                                                    bVar1 = QTest::qCompare(&local_1b88,&local_1bf0,
                                                                                                                                                        
                                                  "testModel.index(0, 0).data().toString()",
                                                  "QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83b);
                                                  QString::~QString(&local_1bf0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1c08);
                                                  QString::~QString(&local_1b88);
                                                  QVariant::~QVariant(&local_1ba8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1c70);
                                                    GenericModel::index((int)&local_1c58,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1c40,&local_1c58,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1ca0,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_1c88,&local_1ca0);
                                                    bVar1 = QTest::qCompare(&local_1c20,&local_1c88,
                                                                                                                                                        
                                                  "testModel.index(0, 1).data().toString()",
                                                  "QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83c);
                                                  QString::~QString(&local_1c88);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1ca0);
                                                  QString::~QString(&local_1c20);
                                                  QVariant::~QVariant(&local_1c40);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1d08);
                                                    GenericModel::index((int)&local_1cf0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1cd8,&local_1cf0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1d38,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_1d20,&local_1d38);
                                                    bVar1 = QTest::qCompare(&local_1cb8,&local_1d20,
                                                                                                                                                        
                                                  "testModel.index(0, 2).data().toString()",
                                                  "QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83d);
                                                  QString::~QString(&local_1d20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1d38);
                                                  QString::~QString(&local_1cb8);
                                                  QVariant::~QVariant(&local_1cd8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1da0);
                                                    GenericModel::index((int)&local_1d88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1d70,&local_1d88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1dd0,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_1db8,&local_1dd0);
                                                    bVar1 = QTest::qCompare(&local_1d50,&local_1db8,
                                                                                                                                                        
                                                  "testModel.index(0, 3).data().toString()",
                                                  "QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83e);
                                                  QString::~QString(&local_1db8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1dd0);
                                                  QString::~QString(&local_1d50);
                                                  QVariant::~QVariant(&local_1d70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1e38);
                                                    GenericModel::index((int)&local_1e20,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1e08,&local_1e20,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1e68,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_1e50,&local_1e68);
                                                    bVar1 = QTest::qCompare(&local_1de8,&local_1e50,
                                                                                                                                                        
                                                  "testModel.index(0, 4).data().toString()",
                                                  "QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x83f);
                                                  QString::~QString(&local_1e50);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1e68);
                                                  QString::~QString(&local_1de8);
                                                  QVariant::~QVariant(&local_1e08);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1ed0);
                                                    GenericModel::index((int)&local_1eb8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1ea0,&local_1eb8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1f00,(Data *)0x0,L"0,2",3);
                                                    QString::QString(&local_1ee8,&local_1f00);
                                                    bVar1 = QTest::qCompare(&local_1e80,&local_1ee8,
                                                                                                                                                        
                                                  "testModel.index(0, 5).data().toString()",
                                                  "QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x840);
                                                  QString::~QString(&local_1ee8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1f00);
                                                  QString::~QString(&local_1e80);
                                                  QVariant::~QVariant(&local_1ea0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1f68);
                                                    GenericModel::index((int)&local_1f50,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1f38,&local_1f50,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1f98,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_1f80,&local_1f98);
                                                    bVar1 = QTest::qCompare(&local_1f18,&local_1f80,
                                                                                                                                                        
                                                  "testModel.index(1, 0).data().toString()",
                                                  "QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x841);
                                                  QString::~QString(&local_1f80);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1f98);
                                                  QString::~QString(&local_1f18);
                                                  QVariant::~QVariant(&local_1f38);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2000);
                                                    GenericModel::index((int)&local_1fe8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1fd0,&local_1fe8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2030,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_2018,&local_2030);
                                                    bVar1 = QTest::qCompare(&local_1fb0,&local_2018,
                                                                                                                                                        
                                                  "testModel.index(1, 1).data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x842);
                                                  QString::~QString(&local_2018);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2030);
                                                  QString::~QString(&local_1fb0);
                                                  QVariant::~QVariant(&local_1fd0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2098);
                                                    GenericModel::index((int)&local_2080,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2068,&local_2080,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_20c8,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_20b0,&local_20c8);
                                                    bVar1 = QTest::qCompare(&local_2048,&local_20b0,
                                                                                                                                                        
                                                  "testModel.index(1, 2).data().toString()",
                                                  "QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x843);
                                                  QString::~QString(&local_20b0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_20c8);
                                                  QString::~QString(&local_2048);
                                                  QVariant::~QVariant(&local_2068);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2130);
                                                    GenericModel::index((int)&local_2118,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2100,&local_2118,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2160,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_2148,&local_2160);
                                                    bVar1 = QTest::qCompare(&local_20e0,&local_2148,
                                                                                                                                                        
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x844);
                                                  QString::~QString(&local_2148);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2160);
                                                  QString::~QString(&local_20e0);
                                                  QVariant::~QVariant(&local_2100);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_21c8);
                                                    GenericModel::index((int)&local_21b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2198,&local_21b0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_21f8,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_21e0,&local_21f8);
                                                    bVar1 = QTest::qCompare(&local_2178,&local_21e0,
                                                                                                                                                        
                                                  "testModel.index(1, 4).data().toString()",
                                                  "QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x845);
                                                  QString::~QString(&local_21e0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_21f8);
                                                  QString::~QString(&local_2178);
                                                  QVariant::~QVariant(&local_2198);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2260);
                                                    GenericModel::index((int)&local_2248,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2230,&local_2248,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2290,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_2278,&local_2290);
                                                    bVar1 = QTest::qCompare(&local_2210,&local_2278,
                                                                                                                                                        
                                                  "testModel.index(1, 5).data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x846);
                                                  QString::~QString(&local_2278);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2290);
                                                  QString::~QString(&local_2210);
                                                  QVariant::~QVariant(&local_2230);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_22b0,(int)&probe + 8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_22b0);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x847);
                                                  QVariant::~QVariant(&local_22b0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_22d0,(int)&probe + 8,1);
                                                    iVar3 = QVariant::toInt((bool *)&local_22d0);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x848);
                                                  QVariant::~QVariant(&local_22d0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_22f0,(int)&probe + 8,2);
                                                    iVar3 = QVariant::toInt((bool *)&local_22f0);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x849);
                                                  QVariant::~QVariant(&local_22f0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2310,(int)&probe + 8,3);
                                                    iVar3 = QVariant::toInt((bool *)&local_2310);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84a);
                                                  QVariant::~QVariant(&local_2310);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2330,(int)&probe + 8,4);
                                                    iVar3 = QVariant::toInt((bool *)&local_2330);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84b);
                                                  QVariant::~QVariant(&local_2330);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2350,(int)&probe + 8,5);
                                                    iVar3 = QVariant::toInt((bool *)&local_2350);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84c);
                                                  QVariant::~QVariant(&local_2350);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_2388);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_8,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_23a0,
                                                                     (DataPointer *)&__range1_8);
                                                    bVar1 = QTest::qCompare(&local_2368,&local_23a0,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84d);
                                                  QString::~QString(&local_23a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_8);
                                                  QString::~QString(&local_2368);
                                                  QVariant::~QVariant(&local_2388);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "oneTwoIndex.column()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84e);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_8 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_8 = &local_658;
                                                    __begin1_8 = __end1_8;
                                                    for (; (QSignalSpy *)__end1_8 != spy_8;
                                                        __end1_8 = __end1_8 + 1) {
                                                      local_23d8 = *__end1_8;
                                                      local_23e0 = QList<QList<QVariant>_>::count
                                                                             (&local_23d8->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_2.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_23e0,
                                                                     (qint32 *)
                                                                     ((long)&args_2.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x850);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00149006;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_2400,
                                                             &local_23d8->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_2400,0);
                                                  QVariant::value<QModelIndex>(&local_2418,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_2418);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x852);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2400,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x853);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2400,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x854);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2400,3);
                                                    QVariant::value<QModelIndex>(&local_2430,pQVar4)
                                                    ;
                                                    bVar1 = QModelIndex::isValid(&local_2430);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x855);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2400,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x856);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_2400);
                                                  if (bVar1) goto LAB_00149006;
                                                  }
                                                  QModelIndex::QModelIndex
                                                            ((QModelIndex *)&oneOneIndex);
                                                  fillTable(this,(QAbstractItemModel *)
                                                                 &probe.field_0x8,2,6,
                                                            (QModelIndex *)&oneOneIndex,0);
                                                  QModelIndex::QModelIndex(&local_2480);
                                                  GenericModel::index((int)local_2468,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            (local_2450,(QModelIndex *)local_2468);
                                                  QModelIndex::QModelIndex(&local_2498);
                                                  QModelIndex::QModelIndex(&local_24b0);
                                                  bVar2 = GenericModel::moveColumns
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)&local_2498,0,
                                                                     (QModelIndex *)0x2,
                                                                     (int)&local_24b0);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveColumns(QModelIndex(), 0, 2, QModelIndex(), 3)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x85b);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2518);
                                                    GenericModel::index((int)&local_2500,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_24e8,&local_2500,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2548,(Data *)0x0,L"0,2",3);
                                                    QString::QString(&local_2530,&local_2548);
                                                    bVar1 = QTest::qCompare(&local_24c8,&local_2530,
                                                                                                                                                        
                                                  "testModel.index(0, 0).data().toString()",
                                                  "QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x85c);
                                                  QString::~QString(&local_2530);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2548);
                                                  QString::~QString(&local_24c8);
                                                  QVariant::~QVariant(&local_24e8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_25b0);
                                                    GenericModel::index((int)&local_2598,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_2580,&local_2598,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_25e0,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_25c8,&local_25e0);
                                                    bVar1 = QTest::qCompare(&local_2560,&local_25c8,
                                                                                                                                                        
                                                  "testModel.index(0, 1).data().toString()",
                                                  "QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x85d);
                                                  QString::~QString(&local_25c8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_25e0);
                                                  QString::~QString(&local_2560);
                                                  QVariant::~QVariant(&local_2580);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2648);
                                                    GenericModel::index((int)&local_2630,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_2618,&local_2630,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2678,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_2660,&local_2678);
                                                    bVar1 = QTest::qCompare(&local_25f8,&local_2660,
                                                                                                                                                        
                                                  "testModel.index(0, 2).data().toString()",
                                                  "QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x85e);
                                                  QString::~QString(&local_2660);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2678);
                                                  QString::~QString(&local_25f8);
                                                  QVariant::~QVariant(&local_2618);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_26e0);
                                                    GenericModel::index((int)&local_26c8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_26b0,&local_26c8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2710,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_26f8,&local_2710);
                                                    bVar1 = QTest::qCompare(&local_2690,&local_26f8,
                                                                                                                                                        
                                                  "testModel.index(0, 3).data().toString()",
                                                  "QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x85f);
                                                  QString::~QString(&local_26f8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2710);
                                                  QString::~QString(&local_2690);
                                                  QVariant::~QVariant(&local_26b0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2778);
                                                    GenericModel::index((int)&local_2760,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_2748,&local_2760,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_27a8,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_2790,&local_27a8);
                                                    bVar1 = QTest::qCompare(&local_2728,&local_2790,
                                                                                                                                                        
                                                  "testModel.index(0, 4).data().toString()",
                                                  "QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x860);
                                                  QString::~QString(&local_2790);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_27a8);
                                                  QString::~QString(&local_2728);
                                                  QVariant::~QVariant(&local_2748);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2810);
                                                    GenericModel::index((int)&local_27f8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_27e0,&local_27f8,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2840,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_2828,&local_2840);
                                                    bVar1 = QTest::qCompare(&local_27c0,&local_2828,
                                                                                                                                                        
                                                  "testModel.index(0, 5).data().toString()",
                                                  "QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x861);
                                                  QString::~QString(&local_2828);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2840);
                                                  QString::~QString(&local_27c0);
                                                  QVariant::~QVariant(&local_27e0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_28a8);
                                                    GenericModel::index((int)&local_2890,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2878,&local_2890,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_28d8,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_28c0,&local_28d8);
                                                    bVar1 = QTest::qCompare(&local_2858,&local_28c0,
                                                                                                                                                        
                                                  "testModel.index(1, 0).data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x862);
                                                  QString::~QString(&local_28c0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_28d8);
                                                  QString::~QString(&local_2858);
                                                  QVariant::~QVariant(&local_2878);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2940);
                                                    GenericModel::index((int)&local_2928,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2910,&local_2928,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2970,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_2958,&local_2970);
                                                    bVar1 = QTest::qCompare(&local_28f0,&local_2958,
                                                                                                                                                        
                                                  "testModel.index(1, 1).data().toString()",
                                                  "QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x863);
                                                  QString::~QString(&local_2958);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2970);
                                                  QString::~QString(&local_28f0);
                                                  QVariant::~QVariant(&local_2910);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_29d8);
                                                    GenericModel::index((int)&local_29c0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_29a8,&local_29c0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2a08,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_29f0,&local_2a08);
                                                    bVar1 = QTest::qCompare(&local_2988,&local_29f0,
                                                                                                                                                        
                                                  "testModel.index(1, 2).data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x864);
                                                  QString::~QString(&local_29f0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2a08);
                                                  QString::~QString(&local_2988);
                                                  QVariant::~QVariant(&local_29a8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2a70);
                                                    GenericModel::index((int)&local_2a58,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2a40,&local_2a58,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2aa0,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_2a88,&local_2aa0);
                                                    bVar1 = QTest::qCompare(&local_2a20,&local_2a88,
                                                                                                                                                        
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x865);
                                                  QString::~QString(&local_2a88);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2aa0);
                                                  QString::~QString(&local_2a20);
                                                  QVariant::~QVariant(&local_2a40);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2b08);
                                                    GenericModel::index((int)&local_2af0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2ad8,&local_2af0,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2b38,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_2b20,&local_2b38);
                                                    bVar1 = QTest::qCompare(&local_2ab8,&local_2b20,
                                                                                                                                                        
                                                  "testModel.index(1, 4).data().toString()",
                                                  "QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x866);
                                                  QString::~QString(&local_2b20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2b38);
                                                  QString::~QString(&local_2ab8);
                                                  QVariant::~QVariant(&local_2ad8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_2ba0);
                                                    GenericModel::index((int)&local_2b88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2b70,&local_2b88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2bd0,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_2bb8,&local_2bd0);
                                                    bVar1 = QTest::qCompare(&local_2b50,&local_2bb8,
                                                                                                                                                        
                                                  "testModel.index(1, 5).data().toString()",
                                                  "QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x867);
                                                  QString::~QString(&local_2bb8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2bd0);
                                                  QString::~QString(&local_2b50);
                                                  QVariant::~QVariant(&local_2b70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2bf0,(int)&probe + 8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_2bf0);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x868);
                                                  QVariant::~QVariant(&local_2bf0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2c10,(int)&probe + 8,1);
                                                    iVar3 = QVariant::toInt((bool *)&local_2c10);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x869);
                                                  QVariant::~QVariant(&local_2c10);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2c30,(int)&probe + 8,2);
                                                    iVar3 = QVariant::toInt((bool *)&local_2c30);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86a);
                                                  QVariant::~QVariant(&local_2c30);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2c50,(int)&probe + 8,3);
                                                    iVar3 = QVariant::toInt((bool *)&local_2c50);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86b);
                                                  QVariant::~QVariant(&local_2c50);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2c70,(int)&probe + 8,4);
                                                    iVar3 = QVariant::toInt((bool *)&local_2c70);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86c);
                                                  QVariant::~QVariant(&local_2c70);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    GenericModel::headerData
                                                              ((int)&local_2c90,(int)&probe + 8,5);
                                                    iVar3 = QVariant::toInt((bool *)&local_2c90);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86d);
                                                  QVariant::~QVariant(&local_2c90);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_2cc8);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_9,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_2ce0,
                                                                     (DataPointer *)&__range1_9);
                                                    bVar1 = QTest::qCompare(&local_2ca8,&local_2ce0,
                                                                                                                                                        
                                                  "oneOneIndex.data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86e);
                                                  QString::~QString(&local_2ce0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_9);
                                                  QString::~QString(&local_2ca8);
                                                  QVariant::~QVariant(&local_2cc8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "oneOneIndex.column()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x86f);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_9 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_9 = &local_658;
                                                    __begin1_9 = __end1_9;
                                                    for (; (QSignalSpy *)__end1_9 != spy_9;
                                                        __end1_9 = __end1_9 + 1) {
                                                      local_2d18 = *__end1_9;
                                                      local_2d20 = QList<QList<QVariant>_>::count
                                                                             (&local_2d18->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_3.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_2d20,
                                                                     (qint32 *)
                                                                     ((long)&args_3.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x871);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_2d40,
                                                             &local_2d18->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_2d40,0);
                                                  QVariant::value<QModelIndex>(&local_2d58,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_2d58);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x873);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2d40,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x874);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2d40,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x875);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2d40,3);
                                                    QVariant::value<QModelIndex>(&local_2d70,pQVar4)
                                                    ;
                                                    bVar1 = QModelIndex::isValid(&local_2d70);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x876);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2d40,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x877);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_2d40);
                                                  if (bVar1) break;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            (local_2450);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
LAB_00149006:
                  QPersistentModelIndex::~QPersistentModelIndex(local_8a0);
                }
              }
            }
          }
        }
      }
    }
LAB_00149012:
    QSignalSpy::~QSignalSpy((QSignalSpy *)(spyArr + 1));
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_5c0);
  ModelTest::~ModelTest((ModelTest *)local_518);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveColumnsTable()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 2, 6);

    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy columnsMovedSpy(&testModel, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(columnsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &columnsMovedSpy};

    QVERIFY(!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), -1, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 6, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 4));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 4);
    }

    fillTable(&testModel, 2, 6);
    oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 0));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 0);
    }

    fillTable(&testModel, 2, 6);
    oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 6));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 5);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 2);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 6);
    }

    fillTable(&testModel, 2, 6);
    QPersistentModelIndex oneOneIndex = testModel.index(1, 1);
    QVERIFY(testModel.moveColumns(QModelIndex(), 0, 2, QModelIndex(), 3));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneOneIndex.data().toString(), QStringLiteral("1,1"));
    QCOMPARE(oneOneIndex.column(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 3);
    }
}